

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O2

curl_hash * Curl_global_host_cache_init(void)

{
  int iVar1;
  curl_hash *pcVar2;
  
  if (host_cache_initialized == '\0') {
    pcVar2 = &hostname_cache;
    iVar1 = Curl_hash_init(&hostname_cache,7,Curl_hash_str,Curl_str_key_compare,freednsentry);
    if (iVar1 == 0) {
      host_cache_initialized = '\x01';
    }
    else {
      pcVar2 = (curl_hash *)0x0;
    }
  }
  else {
    pcVar2 = &hostname_cache;
  }
  return pcVar2;
}

Assistant:

struct curl_hash *Curl_global_host_cache_init(void)
{
  int rc = 0;
  if(!host_cache_initialized) {
    rc = Curl_hash_init(&hostname_cache, 7, Curl_hash_str,
                        Curl_str_key_compare, freednsentry);
    if(!rc)
      host_cache_initialized = 1;
  }
  return rc?NULL:&hostname_cache;
}